

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall Parser::pushConditionalResult(Parser *this,ConditionalResult cond)

{
  pointer *ppCVar1;
  iterator __position;
  ConditionInfo CVar2;
  ConditionInfo local_2;
  
  __position._M_current =
       (this->conditionStack).
       super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>._M_impl.
       super__Vector_impl_data._M_finish;
  CVar2.inUnknownBlock = (bool)(cond == Unknown | __position._M_current[-1].inUnknownBlock & 1U);
  CVar2.inTrueBlock = (bool)(cond != False & __position._M_current[-1].inTrueBlock);
  if (__position._M_current ==
      (this->conditionStack).
      super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Parser::ConditionInfo,std::allocator<Parser::ConditionInfo>>::
    _M_realloc_insert<Parser::ConditionInfo_const&>
              ((vector<Parser::ConditionInfo,std::allocator<Parser::ConditionInfo>> *)
               &this->conditionStack,__position,&local_2);
  }
  else {
    *__position._M_current = CVar2;
    ppCVar1 = &(this->conditionStack).
               super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppCVar1 = *ppCVar1 + 1;
  }
  return;
}

Assistant:

void Parser::pushConditionalResult(ConditionalResult cond)
{
	ConditionInfo info = conditionStack.back();
	info.inTrueBlock = info.inTrueBlock && cond != ConditionalResult::False;
	info.inUnknownBlock = info.inUnknownBlock || cond == ConditionalResult::Unknown;
	conditionStack.push_back(info);
}